

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

bool __thiscall File::unlock(File *this)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  long in_RDI;
  flock fl;
  undefined2 in_stack_ffffffffffffffd0;
  undefined2 in_stack_ffffffffffffffd2;
  undefined4 in_stack_ffffffffffffffd4;
  bool local_1;
  
  flush((File *)CONCAT44(in_stack_ffffffffffffffd4,
                         CONCAT22(in_stack_ffffffffffffffd2,in_stack_ffffffffffffffd0)));
  if (((*(byte *)(in_RDI + 0x29) & 1) == 0) || ((*(byte *)(in_RDI + 0x28) & 1) == 0)) {
    local_1 = false;
  }
  else {
    iVar1 = fileno(*(FILE **)(in_RDI + 0x30));
    iVar1 = fcntl(iVar1,6,&stack0xffffffffffffffd0);
    if (iVar1 == 0) {
      *(undefined1 *)(in_RDI + 0x29) = 0;
      local_1 = (bool)(*(byte *)(in_RDI + 0x28) & 1);
    }
    else {
      *(undefined1 *)(in_RDI + 0x28) = 0;
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      softHSMLog(3,"unlock",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/File.cpp"
                 ,0x2d9,"Could not unlock the file: %s",pcVar3);
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool File::unlock()
{
	flush();

#ifndef _WIN32
	struct flock fl;
	fl.l_type = F_UNLCK;
	fl.l_whence = SEEK_SET;
	fl.l_start = 0;
	fl.l_len = 0;
	fl.l_pid = 0;

	if (!locked || !valid) return false;

	if (fcntl(fileno(stream), F_SETLK, &fl) != 0)
	{
		valid = false;

		ERROR_MSG("Could not unlock the file: %s", strerror(errno));
		return false;
	}
#else
	HANDLE hFile;
	OVERLAPPED o;

	if (!locked || !valid) return false;

	hFile = (HANDLE) _get_osfhandle(_fileno(stream));
	if (hFile == INVALID_HANDLE_VALUE)
	{
		ERROR_MSG("Invalid handle");
		return false;
	}

	memset(&o, 0, sizeof(o));
	if (!UnlockFileEx(hFile, 0, 1, 0, &o))
	{
		DWORD rv = GetLastError();

		valid = false;

		ERROR_MSG("Could not unlock the file: 0x%08x", rv);
		return  false;
	}
#endif
			

	locked = false;

	return valid;
}